

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int memjrnlTruncate(sqlite3_file *pJfd,sqlite_int64 size)

{
  undefined8 *puVar1;
  sqlite3_io_methods *psVar2;
  bool bVar3;
  sqlite3_io_methods *p_00;
  undefined8 *p_01;
  long lVar4;
  MemJournal *p;
  sqlite3_file sVar5;
  sqlite3_file sVar6;
  
  if ((long)pJfd[3].pMethods <= size) {
    return 0;
  }
  if (size == 0) {
    sVar5.pMethods = (sqlite3_io_methods *)0x0;
    p_00 = pJfd[2].pMethods;
    while (sVar6.pMethods = (sqlite3_io_methods *)(pJfd + 2), p_00 != (sqlite3_io_methods *)0x0) {
      psVar2 = *(sqlite3_io_methods **)p_00;
      sqlite3_free(p_00);
      p_00 = psVar2;
    }
  }
  else {
    sVar5.pMethods = (sqlite3_io_methods *)(pJfd + 2);
    lVar4 = (long)*(int *)&pJfd[1].pMethods;
    do {
      sVar5.pMethods = *sVar5.pMethods;
      if (sVar5.pMethods == (sqlite3_io_methods *)0x0) break;
      bVar3 = lVar4 < size;
      lVar4 = lVar4 + *(int *)&pJfd[1].pMethods;
    } while (bVar3);
    if (sVar5.pMethods == (sqlite3_io_methods *)0x0) {
      sVar5.pMethods = (sqlite3_io_methods *)0x0;
      goto LAB_0012bcbe;
    }
    p_01 = *(undefined8 **)sVar5.pMethods;
    while (sVar6.pMethods = sVar5.pMethods, p_01 != (undefined8 *)0x0) {
      puVar1 = (undefined8 *)*p_01;
      sqlite3_free(p_01);
      p_01 = puVar1;
    }
  }
  *(undefined8 *)sVar6.pMethods = 0;
LAB_0012bcbe:
  pJfd[4].pMethods = sVar5.pMethods;
  pJfd[3].pMethods = (sqlite3_io_methods *)size;
  pJfd[5].pMethods = (sqlite3_io_methods *)0x0;
  pJfd[6].pMethods = (sqlite3_io_methods *)0x0;
  return 0;
}

Assistant:

static int memjrnlTruncate(sqlite3_file *pJfd, sqlite_int64 size){
  MemJournal *p = (MemJournal *)pJfd;
  assert( p->endpoint.pChunk==0 || p->endpoint.pChunk->pNext==0 );
  if( size<p->endpoint.iOffset ){
    FileChunk *pIter = 0;
    if( size==0 ){
      memjrnlFreeChunks(p->pFirst);
      p->pFirst = 0;
    }else{
      i64 iOff = p->nChunkSize;
      for(pIter=p->pFirst; ALWAYS(pIter) && iOff<size; pIter=pIter->pNext){
        iOff += p->nChunkSize;
      }
      if( ALWAYS(pIter) ){
        memjrnlFreeChunks(pIter->pNext);
        pIter->pNext = 0;
      }
    }

    p->endpoint.pChunk = pIter;
    p->endpoint.iOffset = size;
    p->readpoint.pChunk = 0;
    p->readpoint.iOffset = 0;
  }
  return SQLITE_OK;
}